

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O0

void __thiscall
QGraphicsProxyWidgetPrivate::removeSubFocusHelper
          (QGraphicsProxyWidgetPrivate *this,QWidget *widget,FocusReason reason)

{
  bool bVar1;
  QObject *pQVar2;
  FocusReason in_EDX;
  QObject *in_RSI;
  long in_FS_OFFSET;
  QPointer<QWidget> widgetGuard;
  QFocusEvent event;
  undefined4 in_stack_ffffffffffffffb8;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QFocusEvent::QFocusEvent((QFocusEvent *)&local_20,FocusOut,in_EDX);
  QPointer<QWidget>::QPointer<void>
            ((QPointer<QWidget> *)in_RSI,(QWidget *)CONCAT44(in_EDX,in_stack_ffffffffffffffb8));
  QCoreApplication::sendEvent(in_RSI,(QEvent *)&local_20);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9b922b);
  if ((bVar1) && (bVar1 = QEvent::isAccepted((QEvent *)&local_20), bVar1)) {
    pQVar2 = &QWidget::style((QWidget *)CONCAT44(in_EDX,in_stack_ffffffffffffffb8))->super_QObject;
    QCoreApplication::sendEvent(pQVar2,(QEvent *)&local_20);
  }
  QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x9b9262);
  QFocusEvent::~QFocusEvent((QFocusEvent *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsProxyWidgetPrivate::removeSubFocusHelper(QWidget *widget, Qt::FocusReason reason)
{
    QFocusEvent event(QEvent::FocusOut, reason);
    QPointer<QWidget> widgetGuard = widget;
    QCoreApplication::sendEvent(widget, &event);
    if (widgetGuard && event.isAccepted())
        QCoreApplication::sendEvent(widget->style(), &event);
}